

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

void __thiscall leveldb::log::Reader::ReportCorruption(Reader *this,uint64_t bytes,char *reason)

{
  Slice *in_RSI;
  Slice *in_RDI;
  char *in_stack_ffffffffffffffa8;
  Reader *in_stack_ffffffffffffffc0;
  
  Slice::Slice(in_RDI,in_stack_ffffffffffffffa8);
  Slice::Slice((Slice *)&stack0xffffffffffffffc0);
  Status::Corruption(in_RSI,in_RDI);
  ReportDrop(in_stack_ffffffffffffffc0,(uint64_t)in_RSI,(Status *)in_RDI);
  Status::~Status((Status *)in_RDI);
  return;
}

Assistant:

void Reader::ReportCorruption(uint64_t bytes, const char* reason) {
  ReportDrop(bytes, Status::Corruption(reason));
}